

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testIDManifest.cpp
# Opt level: O3

void testIDManifest(string *tempDir)

{
  pointer pCVar1;
  pointer pcVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ChannelGroupManifest *pCVar7;
  ChannelGroupManifest *pCVar8;
  string *psVar9;
  ulong uVar10;
  long lVar11;
  ostream *poVar12;
  long *plVar13;
  pointer pCVar14;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  chans2;
  IDManifest m2;
  string fn;
  IDManifest mfst;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  comps;
  IDManifest m8;
  IDManifest m10;
  IDManifest m9;
  undefined1 local_178 [8];
  pointer local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  _Base_ptr local_158;
  size_t local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  ulong local_120;
  string local_118;
  IDManifest local_f8;
  long lStack_e0;
  int local_d4;
  int local_d0;
  int local_cc;
  undefined1 local_c8 [32];
  IDManifest local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  vector *local_70;
  uint local_64;
  IDManifest local_60;
  int local_44;
  int local_40;
  int local_3c;
  
  pcVar2 = (tempDir->_M_dataplus)._M_p;
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,pcVar2,pcVar2 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)&local_118);
  Imf_3_2::IDManifest::IDManifest(&local_f8);
  local_168._M_allocated_capacity._0_2_ = 0x6469;
  local_170 = (pointer)0x2;
  local_168._M_local_buf[2] = '\0';
  local_178 = (undefined1  [8])&local_168;
  pCVar7 = (ChannelGroupManifest *)Imf_3_2::IDManifest::add((string *)&local_f8);
  if (local_178 != (undefined1  [8])&local_168) {
    operator_delete((void *)local_178,
                    CONCAT17(local_168._M_local_buf[7],
                             CONCAT25(local_168._M_allocated_capacity._5_2_,
                                      CONCAT14(local_168._M_local_buf[4],
                                               CONCAT13(local_168._M_local_buf[3],
                                                        CONCAT12(local_168._M_local_buf[2],
                                                                 local_168._M_allocated_capacity.
                                                                 _0_2_))))) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_c8,2,(allocator_type *)local_178);
  std::__cxx11::string::_M_replace
            (local_c8._0_8_,0,*(char **)&((_Rb_tree_header *)(local_c8._0_8_ + 8))->_M_header,
             0x1c4108);
  std::__cxx11::string::_M_replace
            ((ulong)(local_c8._0_8_ + 0x20),0,*(char **)(local_c8._0_8_ + 0x28),0x1c410e);
  Imf_3_2::IDManifest::ChannelGroupManifest::setComponents((vector *)pCVar7);
  std::__cxx11::string::_M_assign((string *)&pCVar7->_hashScheme);
  pCVar7->_lifeTime = LIFETIME_STABLE;
  pCVar8 = (ChannelGroupManifest *)Imf_3_2::IDManifest::ChannelGroupManifest::operator<<(pCVar7,1);
  local_168._M_allocated_capacity._0_2_ = 0x656d;
  local_168._M_local_buf[2] = 'r';
  local_168._M_local_buf[3] = 'i';
  local_168._M_local_buf[4] = 'n';
  local_168._M_allocated_capacity._5_2_ = 0x2f6f;
  local_168._M_local_buf[7] = 'b';
  local_168._M_local_buf[8] = 'o';
  local_168._M_local_buf[9] = 'd';
  local_168._M_local_buf[10] = 'y';
  local_170 = (pointer)0xb;
  local_168._11_4_ = local_168._11_4_ & 0xffffff00;
  local_178 = (undefined1  [8])&local_168;
  pCVar8 = (ChannelGroupManifest *)
           Imf_3_2::IDManifest::ChannelGroupManifest::operator<<(pCVar8,(string *)local_178);
  local_148.field_2._M_allocated_capacity._0_4_ = 0x6c6f6f77;
  local_148._M_string_length = 4;
  local_148.field_2._M_local_buf[4] = '\0';
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  Imf_3_2::IDManifest::ChannelGroupManifest::operator<<(pCVar8,(string *)&local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,
                    CONCAT26(local_148.field_2._M_allocated_capacity._6_2_,
                             CONCAT15(local_148.field_2._M_local_buf[5],
                                      CONCAT14(local_148.field_2._M_local_buf[4],
                                               local_148.field_2._M_allocated_capacity._0_4_))) + 1)
    ;
  }
  if (local_178 != (undefined1  [8])&local_168) {
    operator_delete((void *)local_178,
                    CONCAT17(local_168._M_local_buf[7],
                             CONCAT25(local_168._M_allocated_capacity._5_2_,
                                      CONCAT14(local_168._M_local_buf[4],
                                               CONCAT13(local_168._M_local_buf[3],
                                                        CONCAT12(local_168._M_local_buf[2],
                                                                 local_168._M_allocated_capacity.
                                                                 _0_2_))))) + 1);
  }
  pCVar8 = (ChannelGroupManifest *)Imf_3_2::IDManifest::ChannelGroupManifest::operator<<(pCVar7,2);
  local_168._M_allocated_capacity._0_2_ = 0x656d;
  local_168._M_local_buf[2] = 'r';
  local_168._M_local_buf[3] = 'i';
  local_168._M_local_buf[4] = 'n';
  local_168._M_allocated_capacity._5_2_ = 0x2f6f;
  local_168._M_local_buf[7] = 'b';
  local_168._M_local_buf[8] = 'o';
  local_168._M_local_buf[9] = 'd';
  local_168._M_local_buf[10] = 'y';
  local_170 = (pointer)0xb;
  local_168._11_4_ = local_168._11_4_ & 0xffffff00;
  local_178 = (undefined1  [8])&local_168;
  pCVar8 = (ChannelGroupManifest *)
           Imf_3_2::IDManifest::ChannelGroupManifest::operator<<(pCVar8,(string *)local_178);
  local_148.field_2._M_allocated_capacity._0_4_ = 0x6e696b73;
  local_148._M_string_length = 4;
  local_148.field_2._M_local_buf[4] = '\0';
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  Imf_3_2::IDManifest::ChannelGroupManifest::operator<<(pCVar8,(string *)&local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,
                    CONCAT26(local_148.field_2._M_allocated_capacity._6_2_,
                             CONCAT15(local_148.field_2._M_local_buf[5],
                                      CONCAT14(local_148.field_2._M_local_buf[4],
                                               local_148.field_2._M_allocated_capacity._0_4_))) + 1)
    ;
  }
  if (local_178 != (undefined1  [8])&local_168) {
    operator_delete((void *)local_178,
                    CONCAT17(local_168._M_local_buf[7],
                             CONCAT25(local_168._M_allocated_capacity._5_2_,
                                      CONCAT14(local_168._M_local_buf[4],
                                               CONCAT13(local_168._M_local_buf[3],
                                                        CONCAT12(local_168._M_local_buf[2],
                                                                 local_168._M_allocated_capacity.
                                                                 _0_2_))))) + 1);
  }
  pCVar8 = (ChannelGroupManifest *)Imf_3_2::IDManifest::ChannelGroupManifest::operator<<(pCVar7,3);
  local_168._M_allocated_capacity._0_2_ = 0x656d;
  local_168._M_local_buf[2] = 'r';
  local_168._M_local_buf[3] = 'i';
  local_168._M_local_buf[4] = 'n';
  local_168._M_allocated_capacity._5_2_ = 0x2f6f;
  local_168._M_local_buf[7] = 'b';
  local_168._M_local_buf[8] = 'o';
  local_168._M_local_buf[9] = 'd';
  local_168._M_local_buf[10] = 'y';
  local_170 = (pointer)0xb;
  local_168._11_4_ = local_168._11_4_ & 0xffffff00;
  local_178 = (undefined1  [8])&local_168;
  pCVar8 = (ChannelGroupManifest *)
           Imf_3_2::IDManifest::ChannelGroupManifest::operator<<(pCVar8,(string *)local_178);
  local_148.field_2._M_allocated_capacity._0_4_ = 0x6e696b73;
  local_148._M_string_length = 4;
  local_148.field_2._M_local_buf[4] = '\0';
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  Imf_3_2::IDManifest::ChannelGroupManifest::operator<<(pCVar8,(string *)&local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,
                    CONCAT26(local_148.field_2._M_allocated_capacity._6_2_,
                             CONCAT15(local_148.field_2._M_local_buf[5],
                                      CONCAT14(local_148.field_2._M_local_buf[4],
                                               local_148.field_2._M_allocated_capacity._0_4_))) + 1)
    ;
  }
  if (local_178 != (undefined1  [8])&local_168) {
    operator_delete((void *)local_178,
                    CONCAT17(local_168._M_local_buf[7],
                             CONCAT25(local_168._M_allocated_capacity._5_2_,
                                      CONCAT14(local_168._M_local_buf[4],
                                               CONCAT13(local_168._M_local_buf[3],
                                                        CONCAT12(local_168._M_local_buf[2],
                                                                 local_168._M_allocated_capacity.
                                                                 _0_2_))))) + 1);
  }
  pCVar7 = (ChannelGroupManifest *)Imf_3_2::IDManifest::ChannelGroupManifest::operator<<(pCVar7,4);
  local_168._M_allocated_capacity._0_2_ = 0x656d;
  local_168._M_local_buf[2] = 'r';
  local_168._M_local_buf[3] = 'i';
  local_168._M_local_buf[4] = 'n';
  local_168._M_allocated_capacity._5_2_ = 0x2f6f;
  local_168._M_local_buf[7] = 'e';
  local_168._M_local_buf[8] = 'y';
  local_168._M_local_buf[9] = 'e';
  local_170 = (pointer)0xa;
  local_168._M_local_buf[10] = '\0';
  local_178 = (undefined1  [8])&local_168;
  pCVar7 = (ChannelGroupManifest *)
           Imf_3_2::IDManifest::ChannelGroupManifest::operator<<(pCVar7,(string *)local_178);
  local_148.field_2._M_allocated_capacity._0_4_ = 0x657965;
  local_148._M_string_length = 3;
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  Imf_3_2::IDManifest::ChannelGroupManifest::operator<<(pCVar7,(string *)&local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,
                    CONCAT26(local_148.field_2._M_allocated_capacity._6_2_,
                             CONCAT15(local_148.field_2._M_local_buf[5],
                                      CONCAT14(local_148.field_2._M_local_buf[4],
                                               local_148.field_2._M_allocated_capacity._0_4_))) + 1)
    ;
  }
  if (local_178 != (undefined1  [8])&local_168) {
    operator_delete((void *)local_178,
                    CONCAT17(local_168._M_local_buf[7],
                             CONCAT25(local_168._M_allocated_capacity._5_2_,
                                      CONCAT14(local_168._M_local_buf[4],
                                               CONCAT13(local_168._M_local_buf[3],
                                                        CONCAT12(local_168._M_local_buf[2],
                                                                 local_168._M_allocated_capacity.
                                                                 _0_2_))))) + 1);
  }
  local_158 = (_Base_ptr)&local_170;
  local_170 = (pointer)((ulong)local_170 & 0xffffffff00000000);
  local_168._M_allocated_capacity._0_2_ = 0;
  local_168._M_local_buf[2] = '\0';
  local_168._M_local_buf[3] = '\0';
  local_168._M_local_buf[4] = '\0';
  local_168._M_allocated_capacity._5_2_ = 0;
  local_168._M_local_buf[7] = '\0';
  local_168._M_local_buf[8] = (char)local_158;
  local_168._M_local_buf[9] = (char)((ulong)local_158 >> 8);
  local_168._M_local_buf[10] = (char)((ulong)local_158 >> 0x10);
  local_168._11_4_ = (undefined4)((ulong)local_158 >> 0x18);
  local_168._M_local_buf[0xf] = (char)((ulong)local_158 >> 0x38);
  local_150 = 0;
  local_148.field_2._M_allocated_capacity._0_4_ = 0x74736e69;
  local_148.field_2._M_local_buf[4] = 'a';
  local_148.field_2._M_local_buf[5] = 'n';
  local_148.field_2._M_allocated_capacity._6_2_ = 0x6563;
  local_148.field_2._M_local_buf[8] = '1';
  local_148.field_2._M_local_buf[9] = '\0';
  local_148._M_string_length = 9;
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)local_178,&local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,
                    CONCAT26(local_148.field_2._M_allocated_capacity._6_2_,
                             CONCAT15(local_148.field_2._M_local_buf[5],
                                      CONCAT14(local_148.field_2._M_local_buf[4],
                                               local_148.field_2._M_allocated_capacity._0_4_))) + 1)
    ;
  }
  local_148.field_2._M_allocated_capacity._0_4_ = 0x74736e69;
  local_148.field_2._M_local_buf[4] = 'a';
  local_148.field_2._M_local_buf[5] = 'n';
  local_148.field_2._M_allocated_capacity._6_2_ = 0x6563;
  local_148.field_2._M_local_buf[8] = '2';
  local_148.field_2._M_local_buf[9] = '\0';
  local_148._M_string_length = 9;
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)local_178,&local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,
                    CONCAT26(local_148.field_2._M_allocated_capacity._6_2_,
                             CONCAT15(local_148.field_2._M_local_buf[5],
                                      CONCAT14(local_148.field_2._M_local_buf[4],
                                               local_148.field_2._M_allocated_capacity._0_4_))) + 1)
    ;
  }
  psVar9 = (string *)Imf_3_2::IDManifest::add((set *)&local_f8);
  local_148.field_2._M_allocated_capacity._0_4_ = 0x74736e69;
  local_148.field_2._M_local_buf[4] = 'a';
  local_148.field_2._M_local_buf[5] = 'n';
  local_148.field_2._M_allocated_capacity._6_2_ = 0x6563;
  local_148._M_string_length = 8;
  local_148.field_2._M_local_buf[8] = '\0';
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  Imf_3_2::IDManifest::ChannelGroupManifest::setComponent(psVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,
                    CONCAT26(local_148.field_2._M_allocated_capacity._6_2_,
                             CONCAT15(local_148.field_2._M_local_buf[5],
                                      CONCAT14(local_148.field_2._M_local_buf[4],
                                               local_148.field_2._M_allocated_capacity._0_4_))) + 1)
    ;
  }
  std::__cxx11::string::_M_assign(psVar9 + 0x50);
  std::__cxx11::string::_M_assign(psVar9 + 0x70);
  local_148.field_2._M_allocated_capacity._0_4_ = 0x2f322f31;
  local_148.field_2._M_local_buf[4] = '3';
  local_148.field_2._M_local_buf[5] = '/';
  local_148.field_2._M_allocated_capacity._6_2_ = 0x2f34;
  local_148.field_2._M_local_buf[8] = '5';
  local_148.field_2._M_local_buf[9] = '\0';
  local_148._M_string_length = 9;
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  Imf_3_2::IDManifest::ChannelGroupManifest::insert(psVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,
                    CONCAT26(local_148.field_2._M_allocated_capacity._6_2_,
                             CONCAT15(local_148.field_2._M_local_buf[5],
                                      CONCAT14(local_148.field_2._M_local_buf[4],
                                               local_148.field_2._M_allocated_capacity._0_4_))) + 1)
    ;
  }
  local_148.field_2._M_allocated_capacity._0_4_ = 0x2f372f36;
  local_148.field_2._M_local_buf[4] = '8';
  local_148.field_2._M_local_buf[5] = '/';
  local_148.field_2._M_allocated_capacity._6_2_ = 0x2f39;
  local_148.field_2._M_local_buf[8] = '1';
  local_148.field_2._M_local_buf[9] = '0';
  local_148._M_string_length = 10;
  local_148.field_2._10_4_ = local_148.field_2._10_4_ & 0xffffff00;
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  Imf_3_2::IDManifest::ChannelGroupManifest::insert(psVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,
                    CONCAT26(local_148.field_2._M_allocated_capacity._6_2_,
                             CONCAT15(local_148.field_2._M_local_buf[5],
                                      CONCAT14(local_148.field_2._M_local_buf[4],
                                               local_148.field_2._M_allocated_capacity._0_4_))) + 1)
    ;
  }
  local_148.field_2._M_allocated_capacity._0_4_ = 0x312f3131;
  local_148.field_2._M_local_buf[4] = '2';
  local_148.field_2._M_local_buf[5] = '/';
  local_148.field_2._M_allocated_capacity._6_2_ = 0x3331;
  local_148.field_2._M_local_buf[8] = '/';
  local_148.field_2._M_local_buf[9] = '1';
  local_148.field_2._10_4_ = 0x35312f34;
  local_148._M_string_length = 0xe;
  local_148.field_2._M_local_buf[0xe] = '\0';
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  Imf_3_2::IDManifest::ChannelGroupManifest::insert(psVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,
                    CONCAT26(local_148.field_2._M_allocated_capacity._6_2_,
                             CONCAT15(local_148.field_2._M_local_buf[5],
                                      CONCAT14(local_148.field_2._M_local_buf[4],
                                               local_148.field_2._M_allocated_capacity._0_4_))) + 1)
    ;
  }
  anon_unknown.dwarf_184e74::doReadWriteManifest(&local_f8,&local_118,true);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_178);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_c8);
  std::
  vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
  ::~vector(&local_f8._manifest);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  Imf_3_2::IDManifest::IDManifest((IDManifest *)&local_118);
  Imf_3_2::IDManifest::IDManifest((IDManifest *)&local_148);
  local_168._M_allocated_capacity._0_2_ = 0x6469;
  local_170 = (pointer)0x2;
  local_168._M_local_buf[2] = '\0';
  local_178 = (undefined1  [8])&local_168;
  Imf_3_2::IDManifest::add((string *)&local_118);
  if (local_178 != (undefined1  [8])&local_168) {
    operator_delete((void *)local_178,
                    CONCAT17(local_168._M_local_buf[7],
                             CONCAT25(local_168._M_allocated_capacity._5_2_,
                                      CONCAT14(local_168._M_local_buf[4],
                                               CONCAT13(local_168._M_local_buf[3],
                                                        CONCAT12(local_168._M_local_buf[2],
                                                                 local_168._M_allocated_capacity.
                                                                 _0_2_))))) + 1);
  }
  psVar9 = (string *)Imf_3_2::IDManifest::operator[]((ulong)&local_118);
  local_168._M_allocated_capacity._0_2_ = 0x616e;
  local_168._M_local_buf[2] = 'm';
  local_168._M_local_buf[3] = 'e';
  local_170 = (pointer)0x4;
  local_168._M_local_buf[4] = '\0';
  local_178 = (undefined1  [8])&local_168;
  Imf_3_2::IDManifest::ChannelGroupManifest::setComponent(psVar9);
  if (local_178 != (undefined1  [8])&local_168) {
    operator_delete((void *)local_178,
                    CONCAT17(local_168._M_local_buf[7],
                             CONCAT25(local_168._M_allocated_capacity._5_2_,
                                      CONCAT14(local_168._M_local_buf[4],
                                               CONCAT13(local_168._M_local_buf[3],
                                                        CONCAT12(local_168._M_local_buf[2],
                                                                 local_168._M_allocated_capacity.
                                                                 _0_2_))))) + 1);
  }
  uVar10 = Imf_3_2::IDManifest::operator[]((ulong)&local_118);
  local_168._M_allocated_capacity._0_2_ = 0x6e65;
  local_168._M_local_buf[2] = 't';
  local_168._M_local_buf[3] = 'r';
  local_168._M_local_buf[4] = 'y';
  local_168._M_allocated_capacity._5_2_ = 0x6e4f;
  local_168._M_local_buf[7] = 'e';
  local_170 = (pointer)0x8;
  local_168._M_local_buf[8] = '\0';
  local_178 = (undefined1  [8])&local_168;
  Imf_3_2::IDManifest::ChannelGroupManifest::insert(uVar10,(string *)0x1);
  if (local_178 != (undefined1  [8])&local_168) {
    operator_delete((void *)local_178,
                    CONCAT17(local_168._M_local_buf[7],
                             CONCAT25(local_168._M_allocated_capacity._5_2_,
                                      CONCAT14(local_168._M_local_buf[4],
                                               CONCAT13(local_168._M_local_buf[3],
                                                        CONCAT12(local_168._M_local_buf[2],
                                                                 local_168._M_allocated_capacity.
                                                                 _0_2_))))) + 1);
  }
  local_168._M_allocated_capacity._0_2_ = 0x6469;
  local_168._M_local_buf[2] = '2';
  local_168._M_local_buf[3] = '\0';
  local_170 = (pointer)0x3;
  local_178 = (undefined1  [8])&local_168;
  Imf_3_2::IDManifest::add((string *)&local_148);
  if (local_178 != (undefined1  [8])&local_168) {
    operator_delete((void *)local_178,
                    CONCAT17(local_168._M_local_buf[7],
                             CONCAT25(local_168._M_allocated_capacity._5_2_,
                                      CONCAT14(local_168._M_local_buf[4],
                                               CONCAT13(local_168._M_local_buf[3],
                                                        CONCAT12(local_168._M_local_buf[2],
                                                                 local_168._M_allocated_capacity.
                                                                 _0_2_))))) + 1);
  }
  psVar9 = (string *)Imf_3_2::IDManifest::operator[]((ulong)&local_148);
  local_168._M_allocated_capacity._0_2_ = 0x616e;
  local_168._M_local_buf[2] = 'm';
  local_168._M_local_buf[3] = 'e';
  local_170 = (pointer)0x4;
  local_168._M_local_buf[4] = '\0';
  local_178 = (undefined1  [8])&local_168;
  Imf_3_2::IDManifest::ChannelGroupManifest::setComponent(psVar9);
  if (local_178 != (undefined1  [8])&local_168) {
    operator_delete((void *)local_178,
                    CONCAT17(local_168._M_local_buf[7],
                             CONCAT25(local_168._M_allocated_capacity._5_2_,
                                      CONCAT14(local_168._M_local_buf[4],
                                               CONCAT13(local_168._M_local_buf[3],
                                                        CONCAT12(local_168._M_local_buf[2],
                                                                 local_168._M_allocated_capacity.
                                                                 _0_2_))))) + 1);
  }
  lVar11 = Imf_3_2::IDManifest::operator[]((ulong)&local_148);
  std::__cxx11::string::_M_assign((string *)(lVar11 + 0x70));
  uVar10 = Imf_3_2::IDManifest::operator[]((ulong)&local_148);
  local_168._M_allocated_capacity._0_2_ = 0x6e65;
  local_168._M_local_buf[2] = 't';
  local_168._M_local_buf[3] = 'r';
  local_168._M_local_buf[4] = 'y';
  local_168._M_allocated_capacity._5_2_ = 0x7754;
  local_168._M_local_buf[7] = 'o';
  local_170 = (pointer)0x8;
  local_168._M_local_buf[8] = '\0';
  local_178 = (undefined1  [8])&local_168;
  Imf_3_2::IDManifest::ChannelGroupManifest::insert(uVar10,(string *)0x2);
  if (local_178 != (undefined1  [8])&local_168) {
    operator_delete((void *)local_178,
                    CONCAT17(local_168._M_local_buf[7],
                             CONCAT25(local_168._M_allocated_capacity._5_2_,
                                      CONCAT14(local_168._M_local_buf[4],
                                               CONCAT13(local_168._M_local_buf[3],
                                                        CONCAT12(local_168._M_local_buf[2],
                                                                 local_168._M_allocated_capacity.
                                                                 _0_2_))))) + 1);
  }
  Imf_3_2::IDManifest::IDManifest((IDManifest *)local_178);
  cVar3 = Imf_3_2::IDManifest::merge((IDManifest *)local_178);
  if (cVar3 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"unexpected return value from merge command: m1 into m3",0x36);
  }
  cVar3 = Imf_3_2::IDManifest::merge((IDManifest *)local_178);
  if (cVar3 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"unexpected return value from merge command: m2 into m3",0x36);
  }
  lVar11 = Imf_3_2::IDManifest::size();
  if (lVar11 != 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "expected manifest with two ChannelGroupManifests after merge operation",0x46);
  }
  pCVar7 = (ChannelGroupManifest *)Imf_3_2::IDManifest::operator[]((ulong)local_178);
  pCVar8 = (ChannelGroupManifest *)Imf_3_2::IDManifest::operator[]((ulong)&local_118);
  cVar3 = Imf_3_2::IDManifest::ChannelGroupManifest::operator==(pCVar7,pCVar8);
  if (cVar3 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"manifest merge of m1 failed\n",0x1c);
  }
  pCVar7 = (ChannelGroupManifest *)Imf_3_2::IDManifest::operator[]((ulong)local_178);
  pCVar8 = (ChannelGroupManifest *)Imf_3_2::IDManifest::operator[]((ulong)&local_148);
  cVar3 = Imf_3_2::IDManifest::ChannelGroupManifest::operator==(pCVar7,pCVar8);
  if (cVar3 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"manifest merge of m1 failed\n",0x1c);
  }
  std::
  vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
  ::~vector((vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
             *)local_178);
  Imf_3_2::IDManifest::IDManifest(&local_f8);
  local_168._M_allocated_capacity._0_2_ = 0x6469;
  local_170 = (pointer)0x2;
  local_168._M_local_buf[2] = '\0';
  local_178 = (undefined1  [8])&local_168;
  Imf_3_2::IDManifest::add((string *)&local_f8);
  if (local_178 != (undefined1  [8])&local_168) {
    operator_delete((void *)local_178,
                    CONCAT17(local_168._M_local_buf[7],
                             CONCAT25(local_168._M_allocated_capacity._5_2_,
                                      CONCAT14(local_168._M_local_buf[4],
                                               CONCAT13(local_168._M_local_buf[3],
                                                        CONCAT12(local_168._M_local_buf[2],
                                                                 local_168._M_allocated_capacity.
                                                                 _0_2_))))) + 1);
  }
  lVar11 = Imf_3_2::IDManifest::operator[]((ulong)&local_f8);
  std::__cxx11::string::_M_assign((string *)(lVar11 + 0x70));
  lVar11 = Imf_3_2::IDManifest::operator[]((ulong)&local_f8);
  *(undefined4 *)(lVar11 + 0x48) = 1;
  lVar11 = Imf_3_2::IDManifest::operator[]((ulong)&local_f8);
  std::__cxx11::string::_M_assign((string *)(lVar11 + 0x50));
  psVar9 = (string *)Imf_3_2::IDManifest::operator[]((ulong)&local_f8);
  local_168._M_allocated_capacity._0_2_ = 0x616e;
  local_168._M_local_buf[2] = 'm';
  local_168._M_local_buf[3] = 'e';
  local_170 = (pointer)0x4;
  local_168._M_local_buf[4] = '\0';
  local_178 = (undefined1  [8])&local_168;
  Imf_3_2::IDManifest::ChannelGroupManifest::setComponent(psVar9);
  if (local_178 != (undefined1  [8])&local_168) {
    operator_delete((void *)local_178,
                    CONCAT17(local_168._M_local_buf[7],
                             CONCAT25(local_168._M_allocated_capacity._5_2_,
                                      CONCAT14(local_168._M_local_buf[4],
                                               CONCAT13(local_168._M_local_buf[3],
                                                        CONCAT12(local_168._M_local_buf[2],
                                                                 local_168._M_allocated_capacity.
                                                                 _0_2_))))) + 1);
  }
  uVar10 = Imf_3_2::IDManifest::operator[]((ulong)&local_f8);
  local_168._M_allocated_capacity._0_2_ = 0x6e65;
  local_168._M_local_buf[2] = 't';
  local_168._M_local_buf[3] = 'r';
  local_168._M_local_buf[4] = 'y';
  local_168._M_allocated_capacity._5_2_ = 0x7754;
  local_168._M_local_buf[7] = 'o';
  local_170 = (pointer)0x8;
  local_168._M_local_buf[8] = '\0';
  local_178 = (undefined1  [8])&local_168;
  Imf_3_2::IDManifest::ChannelGroupManifest::insert(uVar10,(string *)0x2);
  if (local_178 != (undefined1  [8])&local_168) {
    operator_delete((void *)local_178,
                    CONCAT17(local_168._M_local_buf[7],
                             CONCAT25(local_168._M_allocated_capacity._5_2_,
                                      CONCAT14(local_168._M_local_buf[4],
                                               CONCAT13(local_168._M_local_buf[3],
                                                        CONCAT12(local_168._M_local_buf[2],
                                                                 local_168._M_allocated_capacity.
                                                                 _0_2_))))) + 1);
  }
  Imf_3_2::IDManifest::IDManifest((IDManifest *)local_c8);
  local_168._M_allocated_capacity._0_2_ = 0x6469;
  local_170 = (pointer)0x2;
  local_168._M_local_buf[2] = '\0';
  local_178 = (undefined1  [8])&local_168;
  Imf_3_2::IDManifest::add((string *)local_c8);
  if (local_178 != (undefined1  [8])&local_168) {
    operator_delete((void *)local_178,
                    CONCAT17(local_168._M_local_buf[7],
                             CONCAT25(local_168._M_allocated_capacity._5_2_,
                                      CONCAT14(local_168._M_local_buf[4],
                                               CONCAT13(local_168._M_local_buf[3],
                                                        CONCAT12(local_168._M_local_buf[2],
                                                                 local_168._M_allocated_capacity.
                                                                 _0_2_))))) + 1);
  }
  psVar9 = (string *)Imf_3_2::IDManifest::operator[]((ulong)local_c8);
  local_168._M_allocated_capacity._0_2_ = 0x616e;
  local_168._M_local_buf[2] = 'm';
  local_168._M_local_buf[3] = 'e';
  local_170 = (pointer)0x4;
  local_168._M_local_buf[4] = '\0';
  local_178 = (undefined1  [8])&local_168;
  Imf_3_2::IDManifest::ChannelGroupManifest::setComponent(psVar9);
  if (local_178 != (undefined1  [8])&local_168) {
    operator_delete((void *)local_178,
                    CONCAT17(local_168._M_local_buf[7],
                             CONCAT25(local_168._M_allocated_capacity._5_2_,
                                      CONCAT14(local_168._M_local_buf[4],
                                               CONCAT13(local_168._M_local_buf[3],
                                                        CONCAT12(local_168._M_local_buf[2],
                                                                 local_168._M_allocated_capacity.
                                                                 _0_2_))))) + 1);
  }
  uVar10 = Imf_3_2::IDManifest::operator[]((ulong)local_c8);
  local_168._M_allocated_capacity._0_2_ = 0x6e65;
  local_168._M_local_buf[2] = 't';
  local_168._M_local_buf[3] = 'r';
  local_168._M_local_buf[4] = 'y';
  local_168._M_allocated_capacity._5_2_ = 0x6e4f;
  local_168._M_local_buf[7] = 'e';
  local_170 = (pointer)0x8;
  local_168._M_local_buf[8] = '\0';
  local_178 = (undefined1  [8])&local_168;
  Imf_3_2::IDManifest::ChannelGroupManifest::insert(uVar10,(string *)0x1);
  if (local_178 != (undefined1  [8])&local_168) {
    operator_delete((void *)local_178,
                    CONCAT17(local_168._M_local_buf[7],
                             CONCAT25(local_168._M_allocated_capacity._5_2_,
                                      CONCAT14(local_168._M_local_buf[4],
                                               CONCAT13(local_168._M_local_buf[3],
                                                        CONCAT12(local_168._M_local_buf[2],
                                                                 local_168._M_allocated_capacity.
                                                                 _0_2_))))) + 1);
  }
  uVar10 = Imf_3_2::IDManifest::operator[]((ulong)local_c8);
  local_168._M_allocated_capacity._0_2_ = 0x6e65;
  local_168._M_local_buf[2] = 't';
  local_168._M_local_buf[3] = 'r';
  local_168._M_local_buf[4] = 'y';
  local_168._M_allocated_capacity._5_2_ = 0x7754;
  local_168._M_local_buf[7] = 'o';
  local_170 = (pointer)0x8;
  local_168._M_local_buf[8] = '\0';
  local_178 = (undefined1  [8])&local_168;
  Imf_3_2::IDManifest::ChannelGroupManifest::insert(uVar10,(string *)0x2);
  if (local_178 != (undefined1  [8])&local_168) {
    operator_delete((void *)local_178,
                    CONCAT17(local_168._M_local_buf[7],
                             CONCAT25(local_168._M_allocated_capacity._5_2_,
                                      CONCAT14(local_168._M_local_buf[4],
                                               CONCAT13(local_168._M_local_buf[3],
                                                        CONCAT12(local_168._M_local_buf[2],
                                                                 local_168._M_allocated_capacity.
                                                                 _0_2_))))) + 1);
  }
  std::
  vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
  ::vector((vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
            *)local_178,
           (vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
            *)&local_118);
  cVar3 = Imf_3_2::IDManifest::merge((IDManifest *)local_178);
  if (cVar3 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"unexpected merge conflict of m3 into m5\n",0x28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"m1:\n",4);
    anon_unknown.dwarf_184e74::operator<<((ostream *)&std::cerr,(IDManifest *)&local_118);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"m3:\n",4);
    anon_unknown.dwarf_184e74::operator<<((ostream *)&std::cerr,&local_f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"m5:\n",4);
    anon_unknown.dwarf_184e74::operator<<((ostream *)&std::cerr,(IDManifest *)local_178);
  }
  cVar3 = Imf_3_2::IDManifest::operator!=((IDManifest *)local_178,(IDManifest *)local_c8);
  if (cVar3 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"unexpected result from merge:\ngot ",0x22);
    anon_unknown.dwarf_184e74::operator<<((ostream *)&std::cerr,(IDManifest *)local_178);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\nexpected ",10);
    anon_unknown.dwarf_184e74::operator<<((ostream *)&std::cerr,(IDManifest *)local_c8);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
  }
  std::
  vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
  ::~vector((vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
             *)local_178);
  std::
  vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
  ::~vector((vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
             *)local_c8);
  std::
  vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
  ::~vector(&local_f8._manifest);
  Imf_3_2::IDManifest::IDManifest(&local_f8);
  local_168._M_allocated_capacity._0_2_ = 0x6469;
  local_170 = (pointer)0x2;
  local_168._M_local_buf[2] = '\0';
  local_178 = (undefined1  [8])&local_168;
  Imf_3_2::IDManifest::add((string *)&local_f8);
  if (local_178 != (undefined1  [8])&local_168) {
    operator_delete((void *)local_178,
                    CONCAT17(local_168._M_local_buf[7],
                             CONCAT25(local_168._M_allocated_capacity._5_2_,
                                      CONCAT14(local_168._M_local_buf[4],
                                               CONCAT13(local_168._M_local_buf[3],
                                                        CONCAT12(local_168._M_local_buf[2],
                                                                 local_168._M_allocated_capacity.
                                                                 _0_2_))))) + 1);
  }
  psVar9 = (string *)Imf_3_2::IDManifest::operator[]((ulong)&local_f8);
  local_168._M_allocated_capacity._0_2_ = 0x6f6e;
  local_168._M_local_buf[2] = 't';
  local_168._M_local_buf[3] = 'n';
  local_168._M_local_buf[4] = 'a';
  local_168._M_allocated_capacity._5_2_ = 0x656d;
  local_170 = (pointer)0x7;
  local_168._M_local_buf[7] = '\0';
  local_178 = (undefined1  [8])&local_168;
  Imf_3_2::IDManifest::ChannelGroupManifest::setComponent(psVar9);
  if (local_178 != (undefined1  [8])&local_168) {
    operator_delete((void *)local_178,
                    CONCAT17(local_168._M_local_buf[7],
                             CONCAT25(local_168._M_allocated_capacity._5_2_,
                                      CONCAT14(local_168._M_local_buf[4],
                                               CONCAT13(local_168._M_local_buf[3],
                                                        CONCAT12(local_168._M_local_buf[2],
                                                                 local_168._M_allocated_capacity.
                                                                 _0_2_))))) + 1);
  }
  std::
  vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
  ::vector((vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
            *)local_c8,
           (vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
            *)&local_118);
  cVar3 = Imf_3_2::IDManifest::merge((IDManifest *)local_c8);
  if (cVar3 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "error: merge should have failed: different components in m6 and m7\n",0x43);
  }
  Imf_3_2::IDManifest::IDManifest(&local_a8);
  local_168._M_allocated_capacity._0_2_ = 0x6469;
  local_170 = (pointer)0x2;
  local_168._M_local_buf[2] = '\0';
  local_178 = (undefined1  [8])&local_168;
  Imf_3_2::IDManifest::add((string *)&local_a8);
  if (local_178 != (undefined1  [8])&local_168) {
    operator_delete((void *)local_178,
                    CONCAT17(local_168._M_local_buf[7],
                             CONCAT25(local_168._M_allocated_capacity._5_2_,
                                      CONCAT14(local_168._M_local_buf[4],
                                               CONCAT13(local_168._M_local_buf[3],
                                                        CONCAT12(local_168._M_local_buf[2],
                                                                 local_168._M_allocated_capacity.
                                                                 _0_2_))))) + 1);
  }
  psVar9 = (string *)Imf_3_2::IDManifest::operator[]((ulong)&local_a8);
  local_168._M_allocated_capacity._0_2_ = 0x616e;
  local_168._M_local_buf[2] = 'm';
  local_168._M_local_buf[3] = 'e';
  local_170 = (pointer)0x4;
  local_168._M_local_buf[4] = '\0';
  local_178 = (undefined1  [8])&local_168;
  Imf_3_2::IDManifest::ChannelGroupManifest::setComponent(psVar9);
  if (local_178 != (undefined1  [8])&local_168) {
    operator_delete((void *)local_178,
                    CONCAT17(local_168._M_local_buf[7],
                             CONCAT25(local_168._M_allocated_capacity._5_2_,
                                      CONCAT14(local_168._M_local_buf[4],
                                               CONCAT13(local_168._M_local_buf[3],
                                                        CONCAT12(local_168._M_local_buf[2],
                                                                 local_168._M_allocated_capacity.
                                                                 _0_2_))))) + 1);
  }
  uVar10 = Imf_3_2::IDManifest::operator[]((ulong)&local_a8);
  local_60._manifest.
  super__Vector_base<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x11;
  local_178 = (undefined1  [8])&local_168;
  local_178 = (undefined1  [8])std::__cxx11::string::_M_create((ulong *)local_178,(ulong)&local_60);
  local_168._M_allocated_capacity._0_2_ =
       SUB82(local_60._manifest.
             super__Vector_base<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
             ._M_impl.super__Vector_impl_data._M_start,0);
  local_168._M_local_buf[2] =
       (char)((ulong)local_60._manifest.
                     super__Vector_base<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 0x10);
  local_168._M_local_buf[3] =
       (char)((ulong)local_60._manifest.
                     super__Vector_base<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 0x18);
  local_168._M_local_buf[4] =
       (char)((ulong)local_60._manifest.
                     super__Vector_base<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 0x20);
  local_168._M_allocated_capacity._5_2_ =
       (undefined2)
       ((ulong)local_60._manifest.
               super__Vector_base<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
               ._M_impl.super__Vector_impl_data._M_start >> 0x28);
  local_168._M_local_buf[7] =
       (char)((ulong)local_60._manifest.
                     super__Vector_base<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 0x38);
  *(undefined8 *)local_178 = 0x7265666669645f61;
  builtin_strncpy((char *)((long)local_178 + 8),"ent_valu",8);
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    *)((long)local_178 + 0x10))->_M_local_buf[0] = 'e';
  local_170 = local_60._manifest.
              super__Vector_base<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
              ._M_impl.super__Vector_impl_data._M_start;
  *(char *)((long)local_178 +
           (long)local_60._manifest.
                 super__Vector_base<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
                 ._M_impl.super__Vector_impl_data._M_start) = '\0';
  Imf_3_2::IDManifest::ChannelGroupManifest::insert(uVar10,(string *)0x1);
  if (local_178 != (undefined1  [8])&local_168) {
    operator_delete((void *)local_178,
                    CONCAT17(local_168._M_local_buf[7],
                             CONCAT25(local_168._M_allocated_capacity._5_2_,
                                      CONCAT14(local_168._M_local_buf[4],
                                               CONCAT13(local_168._M_local_buf[3],
                                                        CONCAT12(local_168._M_local_buf[2],
                                                                 local_168._M_allocated_capacity.
                                                                 _0_2_))))) + 1);
  }
  uVar10 = Imf_3_2::IDManifest::operator[]((ulong)&local_a8);
  local_168._M_allocated_capacity._0_2_ = 0x2061;
  local_168._M_local_buf[2] = 'f';
  local_168._M_local_buf[3] = 'u';
  local_168._M_local_buf[4] = 'r';
  local_168._M_allocated_capacity._5_2_ = 0x6874;
  local_168._M_local_buf[7] = 'e';
  local_168._M_local_buf[8] = 'r';
  local_168._M_local_buf[9] = ' ';
  local_168._M_local_buf[10] = 'v';
  local_168._11_4_ = 0x65756c61;
  local_170 = (pointer)0xf;
  local_168._M_local_buf[0xf] = '\0';
  local_178 = (undefined1  [8])&local_168;
  Imf_3_2::IDManifest::ChannelGroupManifest::insert(uVar10,(string *)0x3);
  if (local_178 != (undefined1  [8])&local_168) {
    operator_delete((void *)local_178,
                    CONCAT17(local_168._M_local_buf[7],
                             CONCAT25(local_168._M_allocated_capacity._5_2_,
                                      CONCAT14(local_168._M_local_buf[4],
                                               CONCAT13(local_168._M_local_buf[3],
                                                        CONCAT12(local_168._M_local_buf[2],
                                                                 local_168._M_allocated_capacity.
                                                                 _0_2_))))) + 1);
  }
  std::
  vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
  ::vector(&local_60._manifest,
           (vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
            *)&local_118);
  cVar3 = Imf_3_2::IDManifest::merge(&local_60);
  if (cVar3 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "error: merge should have failed: conflicting values of ID 1 in m8 and m9\n",0x49);
  }
  Imf_3_2::IDManifest::IDManifest((IDManifest *)&local_88);
  local_168._M_allocated_capacity._0_2_ = 0x6469;
  local_170 = (pointer)0x2;
  local_168._M_local_buf[2] = '\0';
  local_178 = (undefined1  [8])&local_168;
  Imf_3_2::IDManifest::add((string *)local_88._M_local_buf);
  if (local_178 != (undefined1  [8])&local_168) {
    operator_delete((void *)local_178,
                    CONCAT17(local_168._M_local_buf[7],
                             CONCAT25(local_168._M_allocated_capacity._5_2_,
                                      CONCAT14(local_168._M_local_buf[4],
                                               CONCAT13(local_168._M_local_buf[3],
                                                        CONCAT12(local_168._M_local_buf[2],
                                                                 local_168._M_allocated_capacity.
                                                                 _0_2_))))) + 1);
  }
  psVar9 = (string *)Imf_3_2::IDManifest::operator[]((ulong)&local_88);
  local_168._M_allocated_capacity._0_2_ = 0x616e;
  local_168._M_local_buf[2] = 'm';
  local_168._M_local_buf[3] = 'e';
  local_170 = (pointer)0x4;
  local_168._M_local_buf[4] = '\0';
  local_178 = (undefined1  [8])&local_168;
  Imf_3_2::IDManifest::ChannelGroupManifest::setComponent(psVar9);
  if (local_178 != (undefined1  [8])&local_168) {
    operator_delete((void *)local_178,
                    CONCAT17(local_168._M_local_buf[7],
                             CONCAT25(local_168._M_allocated_capacity._5_2_,
                                      CONCAT14(local_168._M_local_buf[4],
                                               CONCAT13(local_168._M_local_buf[3],
                                                        CONCAT12(local_168._M_local_buf[2],
                                                                 local_168._M_allocated_capacity.
                                                                 _0_2_))))) + 1);
  }
  uVar10 = Imf_3_2::IDManifest::operator[]((ulong)&local_88);
  local_168._M_allocated_capacity._0_2_ = 0x6e65;
  local_168._M_local_buf[2] = 't';
  local_168._M_local_buf[3] = 'r';
  local_168._M_local_buf[4] = 'y';
  local_168._M_allocated_capacity._5_2_ = 0x6e4f;
  local_168._M_local_buf[7] = 'e';
  local_170 = (pointer)0x8;
  local_168._M_local_buf[8] = '\0';
  local_178 = (undefined1  [8])&local_168;
  Imf_3_2::IDManifest::ChannelGroupManifest::insert(uVar10,(string *)0x1);
  if (local_178 != (undefined1  [8])&local_168) {
    operator_delete((void *)local_178,
                    CONCAT17(local_168._M_local_buf[7],
                             CONCAT25(local_168._M_allocated_capacity._5_2_,
                                      CONCAT14(local_168._M_local_buf[4],
                                               CONCAT13(local_168._M_local_buf[3],
                                                        CONCAT12(local_168._M_local_buf[2],
                                                                 local_168._M_allocated_capacity.
                                                                 _0_2_))))) + 1);
  }
  uVar10 = Imf_3_2::IDManifest::operator[]((ulong)&local_88);
  local_168._M_allocated_capacity._0_2_ = 0x2061;
  local_168._M_local_buf[2] = 'f';
  local_168._M_local_buf[3] = 'u';
  local_168._M_local_buf[4] = 'r';
  local_168._M_allocated_capacity._5_2_ = 0x6874;
  local_168._M_local_buf[7] = 'e';
  local_168._M_local_buf[8] = 'r';
  local_168._M_local_buf[9] = ' ';
  local_168._M_local_buf[10] = 'v';
  local_168._11_4_ = 0x65756c61;
  local_170 = (pointer)0xf;
  local_168._M_local_buf[0xf] = '\0';
  local_178 = (undefined1  [8])&local_168;
  Imf_3_2::IDManifest::ChannelGroupManifest::insert(uVar10,(string *)0x3);
  if (local_178 != (undefined1  [8])&local_168) {
    operator_delete((void *)local_178,
                    CONCAT17(local_168._M_local_buf[7],
                             CONCAT25(local_168._M_allocated_capacity._5_2_,
                                      CONCAT14(local_168._M_local_buf[4],
                                               CONCAT13(local_168._M_local_buf[3],
                                                        CONCAT12(local_168._M_local_buf[2],
                                                                 local_168._M_allocated_capacity.
                                                                 _0_2_))))) + 1);
  }
  cVar3 = Imf_3_2::IDManifest::operator!=((IDManifest *)&local_88,&local_60);
  if (cVar3 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"unexpected result from merge:\ngot ",0x22);
    anon_unknown.dwarf_184e74::operator<<((ostream *)&std::cerr,&local_60);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," expected ",10);
    anon_unknown.dwarf_184e74::operator<<((ostream *)&std::cerr,(IDManifest *)&local_88);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
  }
  std::
  vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
  ::~vector((vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
             *)&local_88);
  std::
  vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
  ::~vector(&local_60._manifest);
  std::
  vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
  ::~vector(&local_a8._manifest);
  std::
  vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
  ::~vector((vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
             *)local_c8);
  std::
  vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
  ::~vector(&local_f8._manifest);
  std::
  vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
  ::~vector((vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
             *)&local_148);
  std::
  vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
  ::~vector((vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
             *)&local_118);
  pcVar2 = (tempDir->_M_dataplus)._M_p;
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,pcVar2,pcVar2 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)&local_118);
  random_reseed(1);
  pCVar1 = (pointer)&local_f8._manifest.
                     super__Vector_base<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_d4 = 0;
  do {
    iVar4 = random_int(2);
    iVar5 = random_int(2);
    local_a8._manifest.
    super__Vector_base<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8._manifest.
    super__Vector_base<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8._manifest.
    super__Vector_base<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (iVar5 != 0) {
      iVar5 = random_int(0xff);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_a8,(long)(int)(iVar5 + 1U));
      if (-1 < iVar5) {
        local_120 = (ulong)(iVar5 + 1U) << 5;
        uVar10 = 0;
        do {
          local_148._M_dataplus._M_p = (pointer)0x0;
          local_148._M_string_length = 0;
          local_148.field_2._M_allocated_capacity._0_4_ = 0;
          local_148.field_2._M_local_buf[4] = '\0';
          local_148.field_2._M_local_buf[5] = '\0';
          local_148.field_2._M_allocated_capacity._6_2_ = 0;
          anon_unknown.dwarf_184e74::randomWord
                    ((string *)local_178,iVar4 != 0,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_148);
          std::__cxx11::string::operator=
                    ((string *)
                     (&((local_a8._manifest.
                         super__Vector_base<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_channels)._M_t._M_impl.
                       field_0x0 + uVar10),(string *)local_178);
          if (local_178 != (undefined1  [8])&local_168) {
            operator_delete((void *)local_178,
                            CONCAT17(local_168._M_local_buf[7],
                                     CONCAT25(local_168._M_allocated_capacity._5_2_,
                                              CONCAT14(local_168._M_local_buf[4],
                                                       CONCAT13(local_168._M_local_buf[3],
                                                                CONCAT12(local_168._M_local_buf[2],
                                                                         local_168.
                                                                         _M_allocated_capacity._0_2_
                                                                        ))))) + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_148);
          uVar10 = uVar10 + 0x20;
        } while (local_120 != uVar10);
      }
    }
    Imf_3_2::IDManifest::IDManifest(&local_60);
    local_d0 = random_int(10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," testing manifest with ",0x17);
    poVar12 = (ostream *)std::ostream::operator<<(&std::cerr,local_d0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," channel groups of size ",0x18);
    if (0 < local_d0) {
      local_44 = local_d4 * 0x4b0 + 0x4b0;
      iVar5 = 0;
      do {
        local_40 = iVar5;
        iVar5 = random_int(9);
        local_170 = (pointer)((ulong)local_170 & 0xffffffff00000000);
        local_168._M_allocated_capacity._0_2_ = 0;
        local_168._M_local_buf[2] = '\0';
        local_168._M_local_buf[3] = '\0';
        local_168._M_local_buf[4] = '\0';
        local_168._M_allocated_capacity._5_2_ = 0;
        local_168._M_local_buf[7] = '\0';
        local_158 = (_Base_ptr)&local_170;
        local_168._M_local_buf[8] = (char)local_158;
        local_168._M_local_buf[9] = (char)((ulong)local_158 >> 8);
        local_168._M_local_buf[10] = (char)((ulong)local_158 >> 0x10);
        local_168._11_4_ = (undefined4)((ulong)local_158 >> 0x18);
        local_168._M_local_buf[0xf] = (char)((ulong)local_158 >> 0x38);
        local_150 = 0;
        if (-1 < iVar5) {
          iVar5 = iVar5 + 1;
          do {
            local_f8._manifest.
            super__Vector_base<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_f8._manifest.
            super__Vector_base<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_f8._manifest.
            super__Vector_base<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            anon_unknown.dwarf_184e74::randomWord
                      (&local_148,iVar4 != 0,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_f8);
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)local_178,&local_148);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != &local_148.field_2) {
              operator_delete(local_148._M_dataplus._M_p,
                              CONCAT26(local_148.field_2._M_allocated_capacity._6_2_,
                                       CONCAT15(local_148.field_2._M_local_buf[5],
                                                CONCAT14(local_148.field_2._M_local_buf[4],
                                                         local_148.field_2._M_allocated_capacity.
                                                         _0_4_))) + 1);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_f8);
            iVar5 = iVar5 + -1;
          } while (iVar5 != 0);
        }
        local_70 = (vector *)Imf_3_2::IDManifest::add((set *)&local_60);
        iVar5 = random_int(3);
        *(int *)(local_70 + 0x48) = iVar5;
        random_int(2);
        std::__cxx11::string::_M_assign((string *)(local_70 + 0x70));
        random_int(2);
        std::__cxx11::string::_M_assign((string *)(local_70 + 0x50));
        uVar6 = random_int(10);
        uVar10 = (ulong)uVar6;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_88,(long)(int)uVar6,(allocator_type *)&local_148);
        local_120 = uVar10;
        local_64 = uVar6;
        if (0 < (int)uVar6) {
          lVar11 = 0;
          do {
            anon_unknown.dwarf_184e74::randomWord
                      (&local_148,iVar4 != 0,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_a8);
            std::__cxx11::string::operator=
                      ((string *)(local_88._M_allocated_capacity + lVar11),(string *)&local_148);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != &local_148.field_2) {
              operator_delete(local_148._M_dataplus._M_p,
                              CONCAT26(local_148.field_2._M_allocated_capacity._6_2_,
                                       CONCAT15(local_148.field_2._M_local_buf[5],
                                                CONCAT14(local_148.field_2._M_local_buf[4],
                                                         local_148.field_2._M_allocated_capacity.
                                                         _0_4_))) + 1);
            }
            lVar11 = lVar11 + 0x20;
          } while (uVar10 << 5 != lVar11);
        }
        Imf_3_2::IDManifest::ChannelGroupManifest::setComponents(local_70);
        local_cc = random_int(local_44);
        poVar12 = (ostream *)std::ostream::operator<<(&std::cerr,local_cc);
        local_148._M_dataplus._M_p._0_1_ = 0x20;
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,(char *)&local_148,1);
        std::ostream::flush();
        if (0 < local_cc) {
          iVar5 = 0;
          do {
            local_3c = iVar5;
            if (0 < (int)local_64) {
              uVar10 = 0;
              do {
                local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
                local_148._M_string_length = 0;
                local_148.field_2._M_allocated_capacity._0_4_ =
                     local_148.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
                iVar5 = random_int(10);
                if (0 < iVar5) {
                  do {
                    anon_unknown.dwarf_184e74::randomWord
                              ((string *)local_c8,iVar4 != 0,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_a8);
                    random_int(2);
                    plVar13 = (long *)std::__cxx11::string::_M_replace_aux
                                                ((ulong)local_c8,local_c8._8_8_,0,'\x01');
                    pCVar14 = (pointer)(plVar13 + 2);
                    if ((pointer)*plVar13 == pCVar14) {
                      local_f8._manifest.
                      super__Vector_base<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage =
                           *(pointer *)&(pCVar14->_channels)._M_t._M_impl;
                      lStack_e0 = plVar13[3];
                      local_f8._manifest.
                      super__Vector_base<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
                      ._M_impl.super__Vector_impl_data._M_start = pCVar1;
                    }
                    else {
                      local_f8._manifest.
                      super__Vector_base<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage =
                           *(pointer *)&(pCVar14->_channels)._M_t._M_impl;
                      local_f8._manifest.
                      super__Vector_base<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
                      ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar13;
                    }
                    local_f8._manifest.
                    super__Vector_base<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar13[1];
                    *plVar13 = (long)pCVar14;
                    plVar13[1] = 0;
                    *(undefined1 *)(plVar13 + 2) = 0;
                    std::__cxx11::string::_M_append
                              ((char *)&local_148,
                               (ulong)local_f8._manifest.
                                      super__Vector_base<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
                    if (local_f8._manifest.
                        super__Vector_base<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
                        ._M_impl.super__Vector_impl_data._M_start != pCVar1) {
                      operator_delete(local_f8._manifest.
                                      super__Vector_base<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (ulong)&((local_f8._manifest.
                                                super__Vector_base<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage)
                                              ->_channels)._M_t._M_impl.field_0x1);
                    }
                    if ((pointer)local_c8._0_8_ != (pointer)(local_c8 + 0x10)) {
                      operator_delete((void *)local_c8._0_8_,(ulong)(local_c8._16_8_ + 1));
                    }
                    iVar5 = iVar5 + -1;
                  } while (iVar5 != 0);
                }
                std::__cxx11::string::_M_assign
                          ((string *)(uVar10 * 0x20 + local_88._M_allocated_capacity));
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_148._M_dataplus._M_p != &local_148.field_2) {
                  operator_delete(local_148._M_dataplus._M_p,
                                  CONCAT26(local_148.field_2._M_allocated_capacity._6_2_,
                                           CONCAT15(local_148.field_2._M_local_buf[5],
                                                    CONCAT14(local_148.field_2._M_local_buf[4],
                                                             local_148.field_2._M_allocated_capacity
                                                             ._0_4_))) + 1);
                }
                uVar10 = uVar10 + 1;
              } while (uVar10 != local_120);
            }
            Imf_3_2::IDManifest::ChannelGroupManifest::insert(local_70);
            iVar5 = local_3c + 1;
          } while (iVar5 != local_cc);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_88);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_178);
        iVar5 = local_40 + 1;
      } while (iVar5 != local_d0);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"....",4);
    std::ostream::flush();
    anon_unknown.dwarf_184e74::doReadWriteManifest(&local_60,&local_118,false);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ok\n",3);
    std::
    vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
    ::~vector(&local_60._manifest);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_a8);
    local_d4 = local_d4 + 1;
  } while (local_d4 != 0x14);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  iVar4 = 0;
  do {
    Imf_3_2::IDManifest::IDManifest(&local_f8);
    local_168._M_allocated_capacity._0_2_ = 0x6469;
    local_170 = (pointer)0x2;
    local_168._M_local_buf[2] = '\0';
    local_178 = (undefined1  [8])&local_168;
    pCVar7 = (ChannelGroupManifest *)Imf_3_2::IDManifest::add((string *)&local_f8);
    if (local_178 != (undefined1  [8])&local_168) {
      operator_delete((void *)local_178,
                      CONCAT17(local_168._M_local_buf[7],
                               CONCAT25(local_168._M_allocated_capacity._5_2_,
                                        CONCAT14(local_168._M_local_buf[4],
                                                 CONCAT13(local_168._M_local_buf[3],
                                                          CONCAT12(local_168._M_local_buf[2],
                                                                   local_168._M_allocated_capacity.
                                                                   _0_2_))))) + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_c8,2,(allocator_type *)local_178);
    std::__cxx11::string::_M_replace
              (local_c8._0_8_,0,*(char **)&((_Rb_tree_header *)(local_c8._0_8_ + 8))->_M_header,
               0x1c4108);
    std::__cxx11::string::_M_replace
              ((ulong)(local_c8._0_8_ + 0x20),0,*(char **)(local_c8._0_8_ + 0x28),0x1c410e);
    Imf_3_2::IDManifest::ChannelGroupManifest::setComponents((vector *)pCVar7);
    local_178 = (undefined1  [8])&local_168;
    local_a8._manifest.
    super__Vector_base<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x10;
    local_178 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_178,(ulong)&local_a8);
    local_168._M_allocated_capacity._0_2_ =
         SUB82(local_a8._manifest.
               super__Vector_base<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
               ._M_impl.super__Vector_impl_data._M_start,0);
    local_168._M_local_buf[2] =
         (char)((ulong)local_a8._manifest.
                       super__Vector_base<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 0x10);
    local_168._M_local_buf[3] =
         (char)((ulong)local_a8._manifest.
                       super__Vector_base<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 0x18);
    local_168._M_local_buf[4] =
         (char)((ulong)local_a8._manifest.
                       super__Vector_base<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 0x20);
    local_168._M_allocated_capacity._5_2_ =
         (undefined2)
         ((ulong)local_a8._manifest.
                 super__Vector_base<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 0x28);
    local_168._M_local_buf[7] =
         (char)((ulong)local_a8._manifest.
                       super__Vector_base<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 0x38);
    *(undefined8 *)local_178 = 0x6542676e69727473;
    builtin_strncpy((char *)((long)local_178 + 8),"foreInt\n",8);
    local_170 = local_a8._manifest.
                super__Vector_base<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
                ._M_impl.super__Vector_impl_data._M_start;
    (&((local_a8._manifest.
        super__Vector_base<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
        ._M_impl.super__Vector_impl_data._M_start)->_channels)._M_t._M_impl.field_0x0)
    [(long)local_178] = 0;
    Imf_3_2::IDManifest::ChannelGroupManifest::operator<<(pCVar7,(string *)local_178);
    if (local_178 != (undefined1  [8])&local_168) {
      operator_delete((void *)local_178,
                      CONCAT17(local_168._M_local_buf[7],
                               CONCAT25(local_168._M_allocated_capacity._5_2_,
                                        CONCAT14(local_168._M_local_buf[4],
                                                 CONCAT13(local_168._M_local_buf[3],
                                                          CONCAT12(local_168._M_local_buf[2],
                                                                   local_168._M_allocated_capacity.
                                                                   _0_2_))))) + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"ERROR: bad usage of IDManifest not detected in test ",0x34);
    poVar12 = (ostream *)std::ostream::operator<<(&std::cerr,iVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_c8);
    std::
    vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
    ::~vector((vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
               *)&local_f8);
    iVar4 = iVar4 + 1;
  } while (iVar4 != 7);
  return;
}

Assistant:

void
testIDManifest (const std::string& tempDir)
{
    //
    // simple test that the manifest 'round trips' correctly
    //
    testReadWriteManifest (tempDir);

    //
    // test manifest merge operations
    //
    testMerge ();

    // stress test - will randomly generate 'edge cases'
    testLargeManifest (tempDir);

    // test the API prevents creating invalid manifests
    testDoingBadThings ();
}